

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

void pybind11::detail::all_type_info_populate
               (PyTypeObject *t,
               vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
               *bases)

{
  long *plVar1;
  value_type p_Var2;
  _typeobject *p_Var3;
  tuple_iterator tVar4;
  internals *piVar5;
  const_iterator cVar6;
  pointer pptVar7;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *__range5;
  size_t i;
  sequence_fast_readonly sVar8;
  ulong uVar9;
  long *plVar10;
  _Hashtable<_typeobject_*,_std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_typeobject_*>,_std::hash<_typeobject_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this;
  _typeobject *local_68;
  _Hashtable<_typeobject_*,_std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_typeobject_*>,_std::hash<_typeobject_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_60;
  undefined1 auStack_58 [8];
  vector<_typeobject_*,_std::allocator<_typeobject_*>_> check;
  value_type type;
  type_info *tinfo;
  
  check.super__Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_58 = (undefined1  [8])0x0;
  check.super__Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  check.super__Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)t->tp_bases;
  if ((PyObject *)
      check.super__Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (PyObject *)0x0) {
    ((PyObject *)
    check.super__Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage)->ob_refcnt =
         ((PyObject *)
         check.super__Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage)->ob_refcnt + 1;
  }
  sVar8.ptr = (PyObject **)
              &((PyObject *)
               ((long)check.super__Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 0x10))->ob_type;
  if ((((PyObject *)
       check.super__Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage)->ob_type->tp_flags & 0x2000000) != 0) {
    sVar8.ptr = (PyObject **)*sVar8.ptr;
  }
  tVar4 = tuple::end((tuple *)&check.
                               super__Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
  for (; (sequence_fast_readonly)sVar8.ptr != tVar4.super_sequence_fast_readonly.ptr;
      sVar8.ptr = sVar8.ptr + 1) {
    type = (value_type)*sVar8.ptr;
    std::vector<_typeobject*,std::allocator<_typeobject*>>::emplace_back<_typeobject*>
              ((vector<_typeobject*,std::allocator<_typeobject*>> *)auStack_58,&type);
  }
  object::~object((object *)
                  &check.super__Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  piVar5 = get_internals();
  this = &(piVar5->registered_types_py)._M_h;
  uVar9 = 0;
  local_60 = this;
  do {
    if ((ulong)((long)check.super__Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_>.
                      _M_impl.super__Vector_impl_data._M_start - (long)auStack_58 >> 3) <= uVar9) {
      std::_Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_>::~_Vector_base
                ((_Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_> *)auStack_58);
      return;
    }
    check.super__Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = *(pointer *)((long)auStack_58 + uVar9 * 8);
    if ((((((_typeobject *)
           check.super__Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage)->ob_base).ob_base.ob_type)->tp_flags &
        0x80000000) != 0) {
      cVar6 = std::
              _Hashtable<_typeobject_*,_std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_typeobject_*>,_std::hash<_typeobject_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(this,(key_type *)
                          &check.super__Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (cVar6.
          super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
          ._M_cur == (__node_type *)0x0) {
        p_Var3 = check.super__Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage[0x2a];
        if (p_Var3 != (_typeobject *)0x0) {
          if (uVar9 + 1 ==
              (long)check.super__Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_>._M_impl.
                    super__Vector_impl_data._M_start - (long)auStack_58 >> 3) {
            check.super__Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_>._M_impl.
            super__Vector_impl_data._M_start =
                 check.super__Vector_base<_typeobject_*,_std::allocator<_typeobject_*>_>._M_impl.
                 super__Vector_impl_data._M_start + -1;
            uVar9 = uVar9 - 1;
          }
          (p_Var3->ob_base).ob_base.ob_refcnt = (p_Var3->ob_base).ob_base.ob_refcnt + 1;
          sVar8.ptr = (PyObject **)&p_Var3->tp_name;
          if ((((p_Var3->ob_base).ob_base.ob_type)->tp_flags & 0x2000000) != 0) {
            sVar8.ptr = (PyObject **)*sVar8.ptr;
          }
          type = p_Var3;
          tVar4 = tuple::end((tuple *)&type);
          for (; (sequence_fast_readonly)sVar8.ptr != tVar4.super_sequence_fast_readonly.ptr;
              sVar8.ptr = sVar8.ptr + 1) {
            local_68 = (_typeobject *)*sVar8.ptr;
            std::vector<_typeobject*,std::allocator<_typeobject*>>::emplace_back<_typeobject*>
                      ((vector<_typeobject*,std::allocator<_typeobject*>> *)auStack_58,&local_68);
          }
          object::~object((object *)&type);
          this = local_60;
        }
      }
      else {
        plVar1 = *(long **)((long)cVar6.
                                  super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                                  ._M_cur + 0x18);
        for (plVar10 = *(long **)((long)cVar6.
                                        super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                                        ._M_cur + 0x10); this = local_60, plVar10 != plVar1;
            plVar10 = plVar10 + 1) {
          type = (value_type)*plVar10;
          pptVar7 = (bases->
                    super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          do {
            if (pptVar7 ==
                (bases->
                super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
              std::
              vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
              ::push_back(bases,(value_type *)&type);
              break;
            }
            p_Var2 = (value_type)*pptVar7;
            pptVar7 = pptVar7 + 1;
          } while (p_Var2 != type);
        }
      }
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

PYBIND11_NOINLINE inline void all_type_info_populate(PyTypeObject *t, std::vector<type_info *> &bases) {
    std::vector<PyTypeObject *> check;
    for (handle parent : reinterpret_borrow<tuple>(t->tp_bases))
        check.push_back((PyTypeObject *) parent.ptr());

    auto const &type_dict = get_internals().registered_types_py;
    for (size_t i = 0; i < check.size(); i++) {
        auto type = check[i];
        // Ignore Python2 old-style class super type:
        if (!PyType_Check((PyObject *) type)) continue;

        // Check `type` in the current set of registered python types:
        auto it = type_dict.find(type);
        if (it != type_dict.end()) {
            // We found a cache entry for it, so it's either pybind-registered or has pre-computed
            // pybind bases, but we have to make sure we haven't already seen the type(s) before: we
            // want to follow Python/virtual C++ rules that there should only be one instance of a
            // common base.
            for (auto *tinfo : it->second) {
                // NB: Could use a second set here, rather than doing a linear search, but since
                // having a large number of immediate pybind11-registered types seems fairly
                // unlikely, that probably isn't worthwhile.
                bool found = false;
                for (auto *known : bases) {
                    if (known == tinfo) { found = true; break; }
                }
                if (!found) bases.push_back(tinfo);
            }
        }
        else if (type->tp_bases) {
            // It's some python type, so keep follow its bases classes to look for one or more
            // registered types
            if (i + 1 == check.size()) {
                // When we're at the end, we can pop off the current element to avoid growing
                // `check` when adding just one base (which is typical--i.e. when there is no
                // multiple inheritance)
                check.pop_back();
                i--;
            }
            for (handle parent : reinterpret_borrow<tuple>(type->tp_bases))
                check.push_back((PyTypeObject *) parent.ptr());
        }
    }
}